

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_use_pasv(Curl_easy *data,connectdata *conn)

{
  uint uVar1;
  CURLcode CVar2;
  int modeoff;
  CURLcode result;
  ftp_conn *ftpc;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (((*(uint *)&(conn->bits).field_0x4 >> 0x12 & 1) == 0) &&
     ((*(uint *)&(conn->bits).field_0x4 >> 0xc & 1) != 0)) {
    *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xfffbffff | 0x40000;
  }
  uVar1 = (uint)((*(uint *)&(conn->bits).field_0x4 >> 0x12 & 1) == 0);
  CVar2 = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"%s",ftp_state_use_pasv::mode + (int)uVar1);
  if (CVar2 == CURLE_OK) {
    (conn->proto).ftpc.count1 = uVar1;
    _state(data,FTP_PASV);
    Curl_infof(data,"Connect data stream passively");
  }
  return CVar2;
}

Assistant:

static CURLcode ftp_state_use_pasv(struct Curl_easy *data,
                                   struct connectdata *conn)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result = CURLE_OK;
  /*
    Here's the executive summary on what to do:

    PASV is RFC959, expect:
    227 Entering Passive Mode (a1,a2,a3,a4,p1,p2)

    LPSV is RFC1639, expect:
    228 Entering Long Passive Mode (4,4,a1,a2,a3,a4,2,p1,p2)

    EPSV is RFC2428, expect:
    229 Entering Extended Passive Mode (|||port|)

  */

  static const char mode[][5] = { "EPSV", "PASV" };
  int modeoff;

#ifdef PF_INET6
  if(!conn->bits.ftp_use_epsv && conn->bits.ipv6)
    /* EPSV is disabled but we are connected to a IPv6 host, so we ignore the
       request and enable EPSV again! */
    conn->bits.ftp_use_epsv = TRUE;
#endif

  modeoff = conn->bits.ftp_use_epsv?0:1;

  result = Curl_pp_sendf(data, &ftpc->pp, "%s", mode[modeoff]);
  if(!result) {
    ftpc->count1 = modeoff;
    state(data, FTP_PASV);
    infof(data, "Connect data stream passively");
  }
  return result;
}